

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_ktab(BCWriteCtx *ctx,char *p,GCtab *t)

{
  char *pcVar1;
  cTValue *local_68;
  Node *node_1;
  cTValue *pcStack_58;
  MSize i_3;
  TValue *o;
  MSize i_2;
  Node *node;
  MSize hmask;
  MSize i_1;
  TValue *array;
  ptrdiff_t i;
  MSize nhash;
  MSize narray;
  GCtab *t_local;
  char *p_local;
  BCWriteCtx *ctx_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  if (t->asize != 0) {
    array = (TValue *)(ulong)t->asize;
    do {
      array = (TValue *)((long)array - 1);
      if ((long)array < 0) break;
    } while (*(long *)((t->array).ptr64 + (long)array * 8) == -1);
    i._4_4_ = (int)array + 1;
  }
  if (t->hmask != 0) {
    for (node._4_4_ = 0; node._4_4_ <= t->hmask; node._4_4_ = node._4_4_ + 1) {
      i._0_4_ = ((*(long *)((t->node).ptr64 + (ulong)node._4_4_ * 0x18) == -1 ^ 0xffU) & 1) +
                (uint32_t)i;
    }
  }
  pcVar1 = lj_strfmt_wuleb128(p,i._4_4_);
  pcVar1 = lj_strfmt_wuleb128(pcVar1,(uint32_t)i);
  (ctx->sb).w = pcVar1;
  if (i._4_4_ != 0) {
    pcStack_58 = (cTValue *)(t->array).ptr64;
    for (o._4_4_ = 0; o._4_4_ < i._4_4_; o._4_4_ = o._4_4_ + 1) {
      bcwrite_ktabk(ctx,pcStack_58,1);
      pcStack_58 = pcStack_58 + 1;
    }
  }
  if ((uint32_t)i != 0) {
    node_1._4_4_ = (uint32_t)i;
    local_68 = (cTValue *)((t->node).ptr64 + (ulong)t->hmask * 0x18);
    do {
      if (local_68->u64 != 0xffffffffffffffff) {
        bcwrite_ktabk(ctx,local_68 + 1,0);
        bcwrite_ktabk(ctx,local_68,1);
        node_1._4_4_ = node_1._4_4_ - 1;
        if (node_1._4_4_ == 0) {
          return;
        }
      }
      local_68 = local_68 + -3;
    } while( true );
  }
  return;
}

Assistant:

static void bcwrite_ktab(BCWriteCtx *ctx, char *p, const GCtab *t)
{
  MSize narray = 0, nhash = 0;
  if (t->asize > 0) {  /* Determine max. length of array part. */
    ptrdiff_t i;
    TValue *array = tvref(t->array);
    for (i = (ptrdiff_t)t->asize-1; i >= 0; i--)
      if (!tvisnil(&array[i]))
	break;
    narray = (MSize)(i+1);
  }
  if (t->hmask > 0) {  /* Count number of used hash slots. */
    MSize i, hmask = t->hmask;
    Node *node = noderef(t->node);
    for (i = 0; i <= hmask; i++)
      nhash += !tvisnil(&node[i].val);
  }
  /* Write number of array slots and hash slots. */
  p = lj_strfmt_wuleb128(p, narray);
  p = lj_strfmt_wuleb128(p, nhash);
  ctx->sb.w = p;
  if (narray) {  /* Write array entries (may contain nil). */
    MSize i;
    TValue *o = tvref(t->array);
    for (i = 0; i < narray; i++, o++)
      bcwrite_ktabk(ctx, o, 1);
  }
  if (nhash) {  /* Write hash entries. */
    MSize i = nhash;
    Node *node = noderef(t->node) + t->hmask;
    for (;; node--)
      if (!tvisnil(&node->val)) {
	bcwrite_ktabk(ctx, &node->key, 0);
	bcwrite_ktabk(ctx, &node->val, 1);
	if (--i == 0) break;
      }
  }
}